

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O1

void __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Parse(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,Ch *source,size_t length)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  CrtAllocator *pCVar4;
  size_t sVar5;
  Token *pTVar6;
  SizeType SVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  size_t __size;
  uint uVar14;
  char c;
  Token *pTVar15;
  PercentDecodeStream is;
  GenericInsituStringStream<rapidjson::UTF8<char>_> os;
  PercentDecodeStream local_68;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_48;
  
  if (source == (Ch *)0x0) {
    __assert_fail("source != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a3,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->nameBuffer_ != (Ch *)0x0) {
    __assert_fail("nameBuffer_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a4,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->tokens_ != (Token *)0x0) {
    __assert_fail("tokens_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                  ,0x3a5,
                  "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->allocator_ == (CrtAllocator *)0x0) {
    pCVar4 = (CrtAllocator *)operator_new(1);
    this->allocator_ = pCVar4;
    this->ownAllocator_ = pCVar4;
  }
  this->tokenCount_ = 0;
  if (length != 0) {
    sVar5 = 0;
    sVar8 = 0;
    do {
      if (source[sVar5] == '/') {
        sVar8 = sVar8 + 1;
        this->tokenCount_ = sVar8;
      }
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  sVar5 = this->tokenCount_;
  __size = sVar5 * 0x10 + length;
  if (__size == 0) {
    pTVar6 = (Token *)0x0;
  }
  else {
    pTVar6 = (Token *)malloc(__size);
  }
  this->tokens_ = pTVar6;
  pTVar15 = pTVar6 + sVar5;
  this->nameBuffer_ = (Ch *)pTVar15;
  cVar1 = *source;
  uVar12 = (ulong)(cVar1 == '#');
  if ((uVar12 == length) || (source[uVar12] == '/')) {
    do {
      if (length <= uVar12) {
        if (pTVar15 <= (Token *)(this->nameBuffer_ + length)) {
          this->parseErrorCode_ = kPointerParseErrorNone;
          return;
        }
        __assert_fail("name <= nameBuffer_ + length",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                      ,0x419,
                      "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      if (source[uVar12] != '/') {
        __assert_fail("source[i] == \'/\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/pointer.h"
                      ,0x3c2,
                      "void rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<>>>::Parse(const Ch *, size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      uVar12 = uVar12 + 1;
      pTVar6->name = (Ch *)pTVar15;
      uVar13 = 1;
      if (uVar12 < length) {
        uVar13 = 1;
        do {
          c = source[uVar12];
          if (c == '/') break;
          if (cVar1 == '#') {
            if (c == '%') {
              local_68.src_ = source + uVar12;
              local_68.valid_ = true;
              local_68.head_ = local_68.src_;
              local_68.end_ = source + length;
              local_48.src_ = (Ch *)pTVar15;
              local_48.dst_ = (Ch *)pTVar15;
              local_48.head_ = (Ch *)pTVar15;
              bVar2 = UTF8<char>::
                      Validate<rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentDecodeStream,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                                (&local_68,&local_48);
              if ((bVar2) && (local_68.valid_ != false)) {
                lVar9 = (long)local_68.src_ - (long)local_68.head_;
                if ((long)local_48.dst_ - (long)pTVar15 == 1) {
                  lVar9 = lVar9 + -1;
                  c = *(char *)&pTVar15->name;
                  uVar3 = 0;
                }
                else {
                  pTVar15 = (Token *)((long)pTVar15 + ((long)local_48.dst_ - (long)pTVar15));
                  uVar3 = 8;
                  uVar13 = 0;
                }
                uVar12 = uVar12 + lVar9;
              }
              else {
                this->parseErrorCode_ = kPointerParseErrorInvalidPercentEncoding;
                uVar3 = 5;
              }
              if (uVar3 == 0) goto LAB_001276a7;
            }
            else {
              bVar2 = NeedPercentEncode(this,c);
              if (!bVar2) goto LAB_001276a7;
              this->parseErrorCode_ = kPointerParseErrorCharacterMustPercentEncode;
              uVar3 = 5;
            }
          }
          else {
LAB_001276a7:
            uVar10 = uVar12 + 1;
            if (c == '~') {
              if (length <= uVar10) {
LAB_00127709:
                this->parseErrorCode_ = kPointerParseErrorInvalidEscape;
                uVar3 = 5;
                uVar12 = uVar10;
                goto LAB_0012777e;
              }
              if (source[uVar10] == '0') {
                c = '~';
              }
              else {
                if (source[uVar10] != '1') goto LAB_00127709;
                c = '/';
              }
              uVar10 = uVar12 + 2;
            }
            uVar3 = 0;
            if ((byte)(c - 0x3aU) < 0xf6) {
              uVar13 = uVar3;
            }
            *(char *)&pTVar15->name = c;
            pTVar15 = (Token *)((long)&pTVar15->name + 1);
            uVar12 = uVar10;
          }
LAB_0012777e:
          if ((uVar3 & 7) != 0) goto LAB_0012783e;
        } while (uVar12 < length);
      }
      SVar7 = (int)pTVar15 - *(int *)&pTVar6->name;
      pTVar6->length = SVar7;
      if (SVar7 == 0) {
        uVar13 = 0;
      }
      *(Ch *)&pTVar15->name = '\0';
      if (((uVar13 != 0) && (1 < pTVar6->length)) && (*pTVar6->name == '0')) {
        uVar13 = 0;
      }
      uVar3 = 0;
      if ((uVar13 == 0) || ((ulong)pTVar6->length == 0)) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        uVar10 = 1;
        do {
          uVar14 = ((int)pTVar6->name[uVar10 - 1] + uVar11 * 10) - 0x30;
          bVar2 = uVar14 < uVar11;
          if (bVar2) {
            uVar13 = 0;
          }
          if (uVar11 < uVar14) {
            uVar11 = uVar14;
          }
        } while ((!bVar2) && (bVar2 = uVar10 < pTVar6->length, uVar10 = uVar10 + 1, bVar2));
      }
      pTVar15 = (Token *)((long)&pTVar15->name + 1);
      if (uVar13 == 0) {
        uVar11 = 0xffffffff;
      }
      pTVar6->index = uVar11;
      pTVar6 = pTVar6 + 1;
LAB_0012783e:
    } while (uVar3 == 0);
    if (uVar3 != 5) {
      return;
    }
  }
  else {
    this->parseErrorCode_ = kPointerParseErrorTokenMustBeginWithSolidus;
  }
  free(this->tokens_);
  this->nameBuffer_ = (Ch *)0x0;
  this->tokens_ = (Token *)0x0;
  this->tokenCount_ = 0;
  this->parseErrorOffset_ = uVar12;
  return;
}

Assistant:

void Parse(const Ch* source, size_t length) {
        RAPIDJSON_ASSERT(source != NULL);
        RAPIDJSON_ASSERT(nameBuffer_ == 0);
        RAPIDJSON_ASSERT(tokens_ == 0);

        // Create own allocator if user did not supply.
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();

        // Count number of '/' as tokenCount
        tokenCount_ = 0;
        for (const Ch* s = source; s != source + length; s++) 
            if (*s == '/')
                tokenCount_++;

        Token* token = tokens_ = static_cast<Token *>(allocator_->Malloc(tokenCount_ * sizeof(Token) + length * sizeof(Ch)));
        Ch* name = nameBuffer_ = reinterpret_cast<Ch *>(tokens_ + tokenCount_);
        size_t i = 0;

        // Detect if it is a URI fragment
        bool uriFragment = false;
        if (source[i] == '#') {
            uriFragment = true;
            i++;
        }

        if (i != length && source[i] != '/') {
            parseErrorCode_ = kPointerParseErrorTokenMustBeginWithSolidus;
            goto error;
        }

        while (i < length) {
            RAPIDJSON_ASSERT(source[i] == '/');
            i++; // consumes '/'

            token->name = name;
            bool isNumber = true;

            while (i < length && source[i] != '/') {
                Ch c = source[i];
                if (uriFragment) {
                    // Decoding percent-encoding for URI fragment
                    if (c == '%') {
                        PercentDecodeStream is(&source[i], source + length);
                        GenericInsituStringStream<EncodingType> os(name);
                        Ch* begin = os.PutBegin();
                        if (!Transcoder<UTF8<>, EncodingType>().Validate(is, os) || !is.IsValid()) {
                            parseErrorCode_ = kPointerParseErrorInvalidPercentEncoding;
                            goto error;
                        }
                        size_t len = os.PutEnd(begin);
                        i += is.Tell() - 1;
                        if (len == 1)
                            c = *name;
                        else {
                            name += len;
                            isNumber = false;
                            i++;
                            continue;
                        }
                    }
                    else if (NeedPercentEncode(c)) {
                        parseErrorCode_ = kPointerParseErrorCharacterMustPercentEncode;
                        goto error;
                    }
                }

                i++;

                // Escaping "~0" -> '~', "~1" -> '/'
                if (c == '~') {
                    if (i < length) {
                        c = source[i];
                        if (c == '0')       c = '~';
                        else if (c == '1')  c = '/';
                        else {
                            parseErrorCode_ = kPointerParseErrorInvalidEscape;
                            goto error;
                        }
                        i++;
                    }
                    else {
                        parseErrorCode_ = kPointerParseErrorInvalidEscape;
                        goto error;
                    }
                }

                // First check for index: all of characters are digit
                if (c < '0' || c > '9')
                    isNumber = false;

                *name++ = c;
            }
            token->length = static_cast<SizeType>(name - token->name);
            if (token->length == 0)
                isNumber = false;
            *name++ = '\0'; // Null terminator

            // Second check for index: more than one digit cannot have leading zero
            if (isNumber && token->length > 1 && token->name[0] == '0')
                isNumber = false;

            // String to SizeType conversion
            SizeType n = 0;
            if (isNumber) {
                for (size_t j = 0; j < token->length; j++) {
                    SizeType m = n * 10 + static_cast<SizeType>(token->name[j] - '0');
                    if (m < n) {   // overflow detection
                        isNumber = false;
                        break;
                    }
                    n = m;
                }
            }

            token->index = isNumber ? n : kPointerInvalidIndex;
            token++;
        }

        RAPIDJSON_ASSERT(name <= nameBuffer_ + length); // Should not overflow buffer
        parseErrorCode_ = kPointerParseErrorNone;
        return;

    error:
        Allocator::Free(tokens_);
        nameBuffer_ = 0;
        tokens_ = 0;
        tokenCount_ = 0;
        parseErrorOffset_ = i;
        return;
    }